

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O1

uint CalculateCRC32(char *in)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *in;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(in + 1);
    uVar1 = 0xffffffff;
    do {
      uVar1 = uVar1 >> 8 ^ crc_32_tab[(byte)((byte)uVar1 ^ bVar2)];
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
    return ~uVar1;
  }
  return 0;
}

Assistant:

unsigned int CalculateCRC32(const char* in)
{
    unsigned int crc = (unsigned int)-1;
    while (*in != '\0')
    {
        crc = (crc >> 8) ^ crc_32_tab[(crc ^ *in) & 0xFF];
        in++;
    }
    return crc ^ (unsigned int)-1;
}